

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::TruncateOutputLog(cmake *this,char *fname)

{
  cmState *this_00;
  int iVar1;
  char *pcVar2;
  off_t maxFileSize;
  off_t fsize;
  string local_108;
  undefined4 local_e4;
  undefined1 local_e0 [8];
  stat st;
  allocator local_39;
  undefined1 local_38 [8];
  string fullPath;
  char *fname_local;
  cmake *this_local;
  
  fullPath.field_2._8_8_ = fname;
  pcVar2 = GetHomeOutputDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=((string *)local_38,"/");
  std::__cxx11::string::operator+=((string *)local_38,(char *)fullPath.field_2._8_8_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat64(pcVar2,(stat64 *)local_e0);
  if (iVar1 == 0) {
    this_00 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_108,"CMAKE_CACHEFILE_DIR",(allocator *)((long)&fsize + 7));
    pcVar2 = cmState::GetInitializedCacheValue(this_00,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)((long)&fsize + 7));
    if (pcVar2 == (char *)0x0) {
      cmsys::SystemTools::RemoveFile((string *)local_38);
      local_e4 = 1;
    }
    else if ((long)st.st_rdev < 0xc800) {
      local_e4 = 1;
    }
    else {
      local_e4 = 0;
    }
  }
  else {
    local_e4 = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmake::TruncateOutputLog(const char* fname)
{
  std::string fullPath = this->GetHomeOutputDirectory();
  fullPath += "/";
  fullPath += fname;
  struct stat st;
  if (::stat(fullPath.c_str(), &st)) {
    return;
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) {
    cmSystemTools::RemoveFile(fullPath);
    return;
  }
  off_t fsize = st.st_size;
  const off_t maxFileSize = 50 * 1024;
  if (fsize < maxFileSize) {
    // TODO: truncate file
    return;
  }
}